

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O0

cio_error cio_socket_connect(cio_socket *socket,cio_socket_address *endpoint,
                            cio_connect_handler_t handler,void *handler_context)

{
  int iVar1;
  int *piVar2;
  int ret;
  void *handler_context_local;
  cio_connect_handler_t handler_local;
  cio_socket_address *endpoint_local;
  cio_socket *socket_local;
  
  if ((socket == (cio_socket *)0x0) || (endpoint == (cio_socket_address *)0x0)) {
    socket_local._4_4_ = CIO_INVALID_ARGUMENT;
  }
  else if ((endpoint->impl).sa.socket_address.addr.sa_family == 0) {
    socket_local._4_4_ = CIO_INVALID_ARGUMENT;
  }
  else {
    iVar1 = connect((socket->impl).ev.fd,(sockaddr *)&(endpoint->impl).sa.socket_address,
                    (endpoint->impl).len);
    if (iVar1 == 0) {
      (*handler)(socket,handler_context,CIO_SUCCESS);
      socket_local._4_4_ = CIO_SUCCESS;
    }
    else {
      piVar2 = __errno_location();
      if (*piVar2 == 0x73) {
        socket->handler = handler;
        socket->handler_context = handler_context;
        (socket->impl).ev.context = socket;
        (socket->impl).ev.write_callback = connect_callback;
        socket_local._4_4_ =
             cio_linux_eventloop_register_write((socket->impl).loop,&(socket->impl).ev);
      }
      else {
        piVar2 = __errno_location();
        socket_local._4_4_ = -*piVar2;
      }
    }
  }
  return socket_local._4_4_;
}

Assistant:

enum cio_error cio_socket_connect(struct cio_socket *socket, const struct cio_socket_address *endpoint, cio_connect_handler_t handler, void *handler_context)
{
	if (cio_unlikely(socket == NULL) || (endpoint == NULL)) {
		return CIO_INVALID_ARGUMENT;
	}

	if (cio_unlikely((enum cio_address_family)endpoint->impl.sa.socket_address.addr.sa_family == CIO_ADDRESS_FAMILY_UNSPEC)) {
		return CIO_INVALID_ARGUMENT;
	}

	int ret = connect(socket->impl.ev.fd, &endpoint->impl.sa.socket_address.addr, endpoint->impl.len);
	if (ret == 0) {
		handler(socket, handler_context, CIO_SUCCESS);
	} else {
		if (cio_likely(errno == EINPROGRESS)) {
			socket->handler = handler;
			socket->handler_context = handler_context;
			socket->impl.ev.context = socket;
			socket->impl.ev.write_callback = connect_callback;
			return cio_linux_eventloop_register_write(socket->impl.loop, &socket->impl.ev);
		}

		return (enum cio_error)(-errno);
	}

	return CIO_SUCCESS;
}